

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O2

void __thiscall
StringType::GenDynamicSizeRegEx(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  char *pcVar1;
  ID *pIVar2;
  string sStack_68;
  string tmp;
  
  if (this->string_length_var_field_ == (Field *)0x0) {
    pIVar2 = (ID *)0x0;
  }
  else {
    pIVar2 = this->string_length_var_field_->id_;
  }
  pcVar1 = Env::LValue(env,pIVar2);
  pIVar2 = (ID *)0x0;
  Output::println(out_cc,"%s = ",pcVar1);
  out_cc->indent_ = out_cc->indent_ + 1;
  pcVar1 = Env::RValue(env,this->regex_->matcher_id_);
  Output::println(out_cc,"%s.%s(",pcVar1,RegEx::kMatchPrefix);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"%s,",(data->ptr_expr_)._M_dataplus._M_p);
  pcVar1 = Env::RValue(env,end_of_data);
  Output::println(out_cc,"%s - %s);",pcVar1,(data->ptr_expr_)._M_dataplus._M_p);
  out_cc->indent_ = out_cc->indent_ + -2;
  if (this->string_length_var_field_ != (Field *)0x0) {
    pIVar2 = this->string_length_var_field_->id_;
  }
  Env::SetEvaluated(env,pIVar2,true);
  if (this->string_length_var_field_ == (Field *)0x0) {
    pIVar2 = (ID *)0x0;
  }
  else {
    pIVar2 = this->string_length_var_field_->id_;
  }
  pcVar1 = Env::RValue(env,pIVar2);
  Output::println(out_cc,"if ( %s < 0 )",pcVar1);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  strfmt_abi_cxx11_(&tmp,"\"%s\"",(this->regex_->str_)._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&sStack_68,(string *)&tmp);
  GenStringMismatch(this,out_cc,env,data,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void StringType::GenDynamicSizeRegEx(Output* out_cc, Env* env, const DataPtr& data)
	{
	// string_length_var =
	// 	matcher.match_prefix(
	// 		begin,
	//		end);

	out_cc->println("%s = ", env->LValue(string_length_var()));
	out_cc->inc_indent();

	out_cc->println("%s.%s(", env->RValue(regex_->matcher_id()), RegEx::kMatchPrefix);

	out_cc->inc_indent();
	out_cc->println("%s,", data.ptr_expr());
	out_cc->println("%s - %s);", env->RValue(end_of_data), data.ptr_expr());

	out_cc->dec_indent();
	out_cc->dec_indent();

	env->SetEvaluated(string_length_var());

	out_cc->println("if ( %s < 0 )", env->RValue(string_length_var()));
	out_cc->inc_indent();
	out_cc->println("{");
	string tmp = strfmt("\"%s\"", regex_->str().c_str());
	GenStringMismatch(out_cc, env, data, tmp);
	out_cc->println("}");
	out_cc->dec_indent();
	}